

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O2

void duckdb_fastpforlib::fastpack(uint64_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    internal::__fastpack0(in,out);
    return;
  case 1:
    internal::__fastpack1(in,out);
    return;
  case 2:
    internal::__fastpack2(in,out);
    return;
  case 3:
    internal::__fastpack3(in,out);
    return;
  case 4:
    internal::__fastpack4(in,out);
    return;
  case 5:
    internal::__fastpack5(in,out);
    return;
  case 6:
    internal::__fastpack6(in,out);
    return;
  case 7:
    internal::__fastpack7(in,out);
    return;
  case 8:
    internal::__fastpack8(in,out);
    return;
  case 9:
    internal::__fastpack9(in,out);
    return;
  case 10:
    internal::__fastpack10(in,out);
    return;
  case 0xb:
    internal::__fastpack11(in,out);
    return;
  case 0xc:
    internal::__fastpack12(in,out);
    return;
  case 0xd:
    internal::__fastpack13(in,out);
    return;
  case 0xe:
    internal::__fastpack14(in,out);
    return;
  case 0xf:
    internal::__fastpack15(in,out);
    return;
  case 0x10:
    internal::__fastpack16(in,out);
    return;
  case 0x11:
    internal::__fastpack17(in,out);
    return;
  case 0x12:
    internal::__fastpack18(in,out);
    return;
  case 0x13:
    internal::__fastpack19(in,out);
    return;
  case 0x14:
    internal::__fastpack20(in,out);
    return;
  case 0x15:
    internal::__fastpack21(in,out);
    return;
  case 0x16:
    internal::__fastpack22(in,out);
    return;
  case 0x17:
    internal::__fastpack23(in,out);
    return;
  case 0x18:
    internal::__fastpack24(in,out);
    return;
  case 0x19:
    internal::__fastpack25(in,out);
    return;
  case 0x1a:
    internal::__fastpack26(in,out);
    return;
  case 0x1b:
    internal::__fastpack27(in,out);
    return;
  case 0x1c:
    internal::__fastpack28(in,out);
    return;
  case 0x1d:
    internal::__fastpack29(in,out);
    return;
  case 0x1e:
    internal::__fastpack30(in,out);
    return;
  case 0x1f:
    internal::__fastpack31(in,out);
    return;
  case 0x20:
    internal::__fastpack32(in,out);
    return;
  case 0x21:
    internal::__fastpack33(in,out);
    return;
  case 0x22:
    internal::__fastpack34(in,out);
    return;
  case 0x23:
    internal::__fastpack35(in,out);
    return;
  case 0x24:
    internal::__fastpack36(in,out);
    return;
  case 0x25:
    internal::__fastpack37(in,out);
    return;
  case 0x26:
    internal::__fastpack38(in,out);
    return;
  case 0x27:
    internal::__fastpack39(in,out);
    return;
  case 0x28:
    internal::__fastpack40(in,out);
    return;
  case 0x29:
    internal::__fastpack41(in,out);
    return;
  case 0x2a:
    internal::__fastpack42(in,out);
    return;
  case 0x2b:
    internal::__fastpack43(in,out);
    return;
  case 0x2c:
    internal::__fastpack44(in,out);
    return;
  case 0x2d:
    internal::__fastpack45(in,out);
    return;
  case 0x2e:
    internal::__fastpack46(in,out);
    return;
  case 0x2f:
    internal::__fastpack47(in,out);
    return;
  case 0x30:
    internal::__fastpack48(in,out);
    return;
  case 0x31:
    internal::__fastpack49(in,out);
    return;
  case 0x32:
    internal::__fastpack50(in,out);
    return;
  case 0x33:
    internal::__fastpack51(in,out);
    return;
  case 0x34:
    internal::__fastpack52(in,out);
    return;
  case 0x35:
    internal::__fastpack53(in,out);
    return;
  case 0x36:
    internal::__fastpack54(in,out);
    return;
  case 0x37:
    internal::__fastpack55(in,out);
    return;
  case 0x38:
    internal::__fastpack56(in,out);
    return;
  case 0x39:
    internal::__fastpack57(in,out);
    return;
  case 0x3a:
    internal::__fastpack58(in,out);
    return;
  case 0x3b:
    internal::__fastpack59(in,out);
    return;
  case 0x3c:
    internal::__fastpack60(in,out);
    return;
  case 0x3d:
    internal::__fastpack61(in,out);
    return;
  case 0x3e:
    internal::__fastpack62(in,out);
    return;
  case 0x3f:
    internal::__fastpack63(in,out);
    return;
  case 0x40:
    internal::__fastpack64(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastpack(const uint64_t *__restrict in,
                     uint32_t *__restrict out, const uint32_t bit) {
  switch (bit) {
  case 0:
    internal::__fastpack0(in, out);
    break;
  case 1:
    internal::__fastpack1(in, out);
    break;
  case 2:
    internal::__fastpack2(in, out);
    break;
  case 3:
    internal::__fastpack3(in, out);
    break;
  case 4:
    internal::__fastpack4(in, out);
    break;
  case 5:
    internal::__fastpack5(in, out);
    break;
  case 6:
    internal::__fastpack6(in, out);
    break;
  case 7:
    internal::__fastpack7(in, out);
    break;
  case 8:
    internal::__fastpack8(in, out);
    break;
  case 9:
    internal::__fastpack9(in, out);
    break;
  case 10:
    internal::__fastpack10(in, out);
    break;
  case 11:
    internal::__fastpack11(in, out);
    break;
  case 12:
    internal::__fastpack12(in, out);
    break;
  case 13:
    internal::__fastpack13(in, out);
    break;
  case 14:
    internal::__fastpack14(in, out);
    break;
  case 15:
    internal::__fastpack15(in, out);
    break;
  case 16:
    internal::__fastpack16(in, out);
    break;
  case 17:
    internal::__fastpack17(in, out);
    break;
  case 18:
    internal::__fastpack18(in, out);
    break;
  case 19:
    internal::__fastpack19(in, out);
    break;
  case 20:
    internal::__fastpack20(in, out);
    break;
  case 21:
    internal::__fastpack21(in, out);
    break;
  case 22:
    internal::__fastpack22(in, out);
    break;
  case 23:
    internal::__fastpack23(in, out);
    break;
  case 24:
    internal::__fastpack24(in, out);
    break;
  case 25:
    internal::__fastpack25(in, out);
    break;
  case 26:
    internal::__fastpack26(in, out);
    break;
  case 27:
    internal::__fastpack27(in, out);
    break;
  case 28:
    internal::__fastpack28(in, out);
    break;
  case 29:
    internal::__fastpack29(in, out);
    break;
  case 30:
    internal::__fastpack30(in, out);
    break;
  case 31:
    internal::__fastpack31(in, out);
    break;
  case 32:
    internal::__fastpack32(in, out);
    break;
  case 33:
    internal::__fastpack33(in, out);
    break;
  case 34:
    internal::__fastpack34(in, out);
    break;
  case 35:
    internal::__fastpack35(in, out);
    break;
  case 36:
    internal::__fastpack36(in, out);
    break;
  case 37:
    internal::__fastpack37(in, out);
    break;
  case 38:
    internal::__fastpack38(in, out);
    break;
  case 39:
    internal::__fastpack39(in, out);
    break;
  case 40:
    internal::__fastpack40(in, out);
    break;
  case 41:
    internal::__fastpack41(in, out);
    break;
  case 42:
    internal::__fastpack42(in, out);
    break;
  case 43:
    internal::__fastpack43(in, out);
    break;
  case 44:
    internal::__fastpack44(in, out);
    break;
  case 45:
    internal::__fastpack45(in, out);
    break;
  case 46:
    internal::__fastpack46(in, out);
    break;
  case 47:
    internal::__fastpack47(in, out);
    break;
  case 48:
    internal::__fastpack48(in, out);
    break;
  case 49:
    internal::__fastpack49(in, out);
    break;
  case 50:
    internal::__fastpack50(in, out);
    break;
  case 51:
    internal::__fastpack51(in, out);
    break;
  case 52:
    internal::__fastpack52(in, out);
    break;
  case 53:
    internal::__fastpack53(in, out);
    break;
  case 54:
    internal::__fastpack54(in, out);
    break;
  case 55:
    internal::__fastpack55(in, out);
    break;
  case 56:
    internal::__fastpack56(in, out);
    break;
  case 57:
    internal::__fastpack57(in, out);
    break;
  case 58:
    internal::__fastpack58(in, out);
    break;
  case 59:
    internal::__fastpack59(in, out);
    break;
  case 60:
    internal::__fastpack60(in, out);
    break;
  case 61:
    internal::__fastpack61(in, out);
    break;
  case 62:
    internal::__fastpack62(in, out);
    break;
  case 63:
    internal::__fastpack63(in, out);
    break;
  case 64:
    internal::__fastpack64(in, out);
    break;
  default:
	throw std::logic_error("Invalid bit width for bitpacking");
  }
}